

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O1

void __thiscall FKeyBindings::DefaultBind(FKeyBindings *this,char *keyname,char *cmd)

{
  char *__s1;
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  
  iVar1 = GetKeyFromName(keyname);
  if (iVar1 == 0) {
    Printf("Unknown key \"%s\"\n",keyname);
    return;
  }
  if (*(int *)(this->Binds[iVar1].Chars + -0xc) == 0) {
    lVar3 = 0;
    while ((__s1 = this->Binds[lVar3].Chars, *(int *)(__s1 + -0xc) == 0 ||
           (iVar2 = strcasecmp(__s1,cmd), iVar2 != 0))) {
      lVar3 = lVar3 + 1;
      if (lVar3 == 0x1c4) {
        FString::operator=(this->Binds + iVar1,cmd);
        return;
      }
    }
    return;
  }
  return;
}

Assistant:

void FKeyBindings::DefaultBind(const char *keyname, const char *cmd)
{
	int key = GetKeyFromName (keyname);
	if (key == 0)
	{
		Printf ("Unknown key \"%s\"\n", keyname);
		return;
	}
	if (!Binds[key].IsEmpty())
	{ // This key is already bound.
		return;
	}
	for (int i = 0; i < NUM_KEYS; ++i)
	{
		if (!Binds[i].IsEmpty() && stricmp (Binds[i], cmd) == 0)
		{ // This command is already bound to a key.
			return;
		}
	}
	// It is safe to do the bind, so do it.
	Binds[key] = cmd;
}